

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_9195::verifyPixelsAreEqual<Imath_3_2::half>
               (FlatImageChannel *c1,FlatImageChannel *c2,int dx,int dy)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ImageLevel *this;
  Box2i *pBVar5;
  ArgExc *this_00;
  int in_EDX;
  undefined8 in_RSI;
  ImageChannel *in_RDI;
  float fVar6;
  float fVar7;
  int x;
  int y;
  int yStep;
  int xStep;
  Box2i *dataWindow;
  TypedFlatImageChannel<Imath_3_2::half> *tc2;
  TypedFlatImageChannel<Imath_3_2::half> *tc1;
  half *in_stack_ffffffffffffff90;
  int local_40;
  int local_3c;
  
  lVar3 = __dynamic_cast(in_RDI,&Imf_3_4::FlatImageChannel::typeinfo,
                         &Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::typeinfo,0);
  if (lVar3 == 0) {
    __cxa_bad_cast();
  }
  lVar4 = __dynamic_cast(in_RSI,&Imf_3_4::FlatImageChannel::typeinfo,
                         &Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::typeinfo,0);
  if (lVar4 == 0) {
    __cxa_bad_cast();
  }
  this = Imf_3_4::ImageChannel::level(in_RDI);
  pBVar5 = Imf_3_4::ImageLevel::dataWindow(this);
  iVar1 = Imf_3_4::ImageChannel::xSampling(in_RDI);
  iVar2 = Imf_3_4::ImageChannel::ySampling(in_RDI);
  local_3c = (pBVar5->min).y;
  do {
    if ((pBVar5->max).y < local_3c) {
      return;
    }
    for (local_40 = (pBVar5->min).x; local_40 <= (pBVar5->max).x; local_40 = iVar1 + local_40) {
      Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::at((int)lVar3,local_40);
      fVar6 = Imath_3_2::half::operator_cast_to_float(in_stack_ffffffffffffff90);
      Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::at((int)lVar4,local_40 + in_EDX);
      fVar7 = Imath_3_2::half::operator_cast_to_float(in_stack_ffffffffffffff90);
      if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"different pixel values");
        __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
    }
    local_3c = iVar2 + local_3c;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual (
    const FlatImageChannel& c1, const FlatImageChannel& c2, int dx, int dy)
{
    const TypedFlatImageChannel<T>& tc1 =
        dynamic_cast<const TypedFlatImageChannel<T>&> (c1);

    const TypedFlatImageChannel<T>& tc2 =
        dynamic_cast<const TypedFlatImageChannel<T>&> (c2);

    const Box2i& dataWindow = c1.level ().dataWindow ();
    int          xStep      = c1.xSampling ();
    int          yStep      = c1.ySampling ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += yStep)
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; x += xStep)
            if (tc1.at (x, y) != tc2.at (x + dx, y + dy))
                throw ArgExc ("different pixel values");
}